

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::test_api::GL::glslVer_abi_cxx11_
          (string *__return_storage_ptr__,GL *this,bool compute)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)this == 0) {
    __s = "#version 400";
    __a = &local_a;
  }
  else {
    __s = "#version 430";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static std::string glslVer(bool compute = false)
	{
		if (compute)
		{
			return "#version 430";
		}
		else
		{
			return "#version 400";
		}
	}